

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_dpb_mgr.c
# Opt level: O1

void ihevc_dpb_mgr_del_ref(dpb_mgr_t *ps_dpb_mgr,buf_mgr_t *ps_buf_mgr,WORD32 i4_abs_poc)

{
  byte bVar1;
  dpb_info_t *pdVar2;
  dpb_info_t *pdVar3;
  dpb_info_t *pdVar4;
  uint uVar5;
  uint uVar6;
  
  pdVar2 = ps_dpb_mgr->ps_dpb_head;
  pdVar3 = pdVar2;
  pdVar4 = pdVar2;
  if (pdVar2->ps_pic_buf->i4_abs_poc != i4_abs_poc) {
    bVar1 = ps_dpb_mgr->u1_num_ref_bufs;
    uVar5 = 1;
    uVar6 = uVar5;
    if (1 < bVar1) {
      do {
        pdVar4 = pdVar3->ps_prev_dpb;
        uVar6 = uVar5;
        if (pdVar4->ps_pic_buf->i4_abs_poc == i4_abs_poc) break;
        uVar5 = uVar5 + 1;
        pdVar3 = pdVar4;
        uVar6 = (uint)bVar1;
      } while (bVar1 != uVar5);
    }
    if (uVar6 == bVar1) {
      return;
    }
    pdVar4 = pdVar3->ps_prev_dpb;
  }
  if (pdVar4 == pdVar2) {
    ps_dpb_mgr->ps_dpb_head = pdVar4->ps_prev_dpb;
  }
  else {
    pdVar3->ps_prev_dpb = pdVar4->ps_prev_dpb;
    pdVar4->ps_prev_dpb = (dpb_info_t *)0x0;
  }
  ps_dpb_mgr->u1_num_ref_bufs = ps_dpb_mgr->u1_num_ref_bufs + 0xff;
  ihevc_buf_mgr_release(ps_buf_mgr,(uint)pdVar4->ps_pic_buf->u1_buf_id,2);
  pdVar4->ps_pic_buf = (pic_buf_t *)0x0;
  pdVar4->ps_prev_dpb = (dpb_info_t *)0x0;
  return;
}

Assistant:

void ihevc_dpb_mgr_del_ref(dpb_mgr_t *ps_dpb_mgr,
                           buf_mgr_t *ps_buf_mgr,
                           WORD32 i4_abs_poc)
{
    int i;
    dpb_info_t *ps_next_dpb;

    dpb_info_t *ps_unmark_node;
    UWORD8 u1_del_node;
    UNUSED(u1_del_node);
    u1_del_node = 0;

    /* Find the node with matching absolute POC */
    ps_next_dpb = ps_dpb_mgr->ps_dpb_head;
    if(ps_next_dpb->ps_pic_buf->i4_abs_poc == i4_abs_poc)
    {
        ps_unmark_node = ps_next_dpb;
    }
    else
    {
        for(i = 1; i < ps_dpb_mgr->u1_num_ref_bufs; i++)
        {
            if(ps_next_dpb->ps_prev_dpb->ps_pic_buf->i4_abs_poc == i4_abs_poc)
                break;
            ps_next_dpb = ps_next_dpb->ps_prev_dpb;
        }

        if(i == ps_dpb_mgr->u1_num_ref_bufs)
        {
            return;
        }
        else
            ps_unmark_node = ps_next_dpb->ps_prev_dpb;
    }

    if(ps_unmark_node == ps_dpb_mgr->ps_dpb_head)
    {
        ps_dpb_mgr->ps_dpb_head = ps_unmark_node->ps_prev_dpb;
    }
    else
    {
        ps_next_dpb->ps_prev_dpb = ps_unmark_node->ps_prev_dpb; //update link
        ps_unmark_node->ps_prev_dpb = NULL;
    }
    ps_dpb_mgr->u1_num_ref_bufs--; //decrement buffer count

    /* Release the physical buffer */
    ihevc_buf_mgr_release((buf_mgr_t *)ps_buf_mgr, ps_unmark_node->ps_pic_buf->u1_buf_id,
                          BUF_MGR_REF);
    ps_unmark_node->ps_prev_dpb = NULL;
    ps_unmark_node->ps_pic_buf = NULL;
}